

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_container(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  lyd_node *plVar1;
  LY_ERR LVar2;
  lysp_node *parent_00;
  lysp_node *plVar3;
  char *pcVar4;
  lysp_node **pplVar5;
  char *format;
  lysp_restr **extraout_RDX;
  lysp_restr **extraout_RDX_00;
  lysp_restr **restrs;
  lysp_restr **extraout_RDX_01;
  lysp_restr **extraout_RDX_02;
  ly_ctx *plVar6;
  ly_stmt lVar7;
  lysp_node *plVar8;
  lysp_ext_instance **exts_00;
  bool bVar9;
  undefined4 uStack_b0;
  ly_stmt kw;
  char **local_a8;
  char *word;
  size_t word_len;
  uint16_t *local_90;
  lysp_qname **local_88;
  lysp_ext_instance **local_80;
  lysp_node **local_78;
  lysp_qname **local_70;
  lysp_node **local_68;
  uint16_t *local_60;
  lysp_node **local_58;
  char **local_50;
  lysp_node *local_48;
  char **local_40;
  char *buf;
  
  parent_00 = (lysp_node *)calloc(1,0x80);
  if (parent_00 == (lysp_node *)0x0) {
    LVar2 = LY_EMEM;
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_container");
  }
  else {
    plVar8 = *siblings;
    if (*siblings != (lysp_node *)0x0) {
      do {
        plVar3 = plVar8;
        plVar8 = plVar3->next;
      } while (plVar8 != (lysp_node *)0x0);
      siblings = &plVar3->next;
    }
    *siblings = parent_00;
    parent_00->nodetype = 1;
    parent_00->parent = parent;
    exts_00 = (lysp_ext_instance **)&buf;
    LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts_00,&word_len);
    if (LVar2 == LY_SUCCESS) {
      if (buf == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = word;
        if (word_len == 0) {
          pcVar4 = "";
        }
        LVar2 = lydict_insert(plVar6,pcVar4,word_len,&parent_00->name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar2 = lydict_insert_zc(plVar6,word,&parent_00->name);
      }
      if ((LVar2 == LY_SUCCESS) &&
         (LVar2 = get_keyword(ctx,&kw,&word,&word_len), LVar2 == LY_SUCCESS)) {
        if (kw == LY_STMT_SYNTAX_SEMICOLON) {
          bVar9 = false;
          restrs = extraout_RDX;
        }
        else {
          if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar4 = lyplg_ext_stmt2str(kw);
            ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
            return LY_EVALID;
          }
          LVar2 = get_keyword(ctx,&kw,&word,&word_len);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
          restrs = extraout_RDX_00;
        }
        exts = &parent_00->exts;
        local_80 = &parent_00[1].exts;
        local_40 = &parent_00[1].dsc;
        local_88 = &parent_00[1].iffeatures;
        local_48 = parent_00 + 1;
        local_50 = &parent_00[1].name;
        local_a8 = &parent_00[1].ref;
        local_58 = &parent_00[1].next;
        local_60 = &parent_00[1].nodetype;
        local_90 = &parent_00->flags;
        local_68 = (lysp_node **)&parent_00->ref;
        local_70 = &parent_00->iffeatures;
        local_78 = (lysp_node **)&parent_00->dsc;
        lVar7 = kw;
        do {
          if (!bVar9) {
            return LY_SUCCESS;
          }
          if (lVar7 == LY_STMT_NOTIFICATION) {
            plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar1[2].schema < 2) {
              plVar6 = (ly_ctx *)**(undefined8 **)plVar1;
              pcVar4 = "notification";
LAB_00172641:
              format = 
              "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
              ;
LAB_00172671:
              ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar4,"container");
              return LY_EVALID;
            }
            LVar2 = parse_notif(ctx,parent_00,(lysp_node_notif **)local_80);
          }
          else if (lVar7 == LY_STMT_ACTION) {
            plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar1[2].schema < 2) {
              plVar6 = (ly_ctx *)**(undefined8 **)plVar1;
              pcVar4 = "action";
              goto LAB_00172641;
            }
            LVar2 = parse_action(ctx,parent_00,(lysp_node_action **)local_88);
          }
          else {
            if (lVar7 == LY_STMT_ANYDATA) {
              plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar1[2].schema < 2) {
                plVar6 = (ly_ctx *)**(undefined8 **)plVar1;
                pcVar4 = "anydata";
                goto LAB_00172641;
              }
            }
            else if (lVar7 != LY_STMT_ANYXML) {
              if (lVar7 == LY_STMT_CHOICE) {
                LVar2 = parse_choice(ctx,parent_00,(lysp_node **)local_a8);
              }
              else if (lVar7 == LY_STMT_CONTAINER) {
                LVar2 = parse_container(ctx,parent_00,(lysp_node **)local_a8);
              }
              else if (lVar7 == LY_STMT_GROUPING) {
                LVar2 = parse_grouping(ctx,parent_00,(lysp_node_grp **)local_40);
              }
              else if (lVar7 == LY_STMT_LEAF) {
                LVar2 = parse_leaf(ctx,parent_00,(lysp_node **)local_a8);
              }
              else if (lVar7 == LY_STMT_LEAF_LIST) {
                LVar2 = parse_leaflist(ctx,parent_00,(lysp_node **)local_a8);
              }
              else if (lVar7 == LY_STMT_LIST) {
                LVar2 = parse_list(ctx,parent_00,(lysp_node **)local_a8);
              }
              else if (lVar7 == LY_STMT_USES) {
                LVar2 = parse_uses(ctx,parent_00,(lysp_node **)local_a8);
              }
              else if (lVar7 == LY_STMT_WHEN) {
                LVar2 = parse_when(ctx,(lysp_when **)local_60);
              }
              else {
                if (lVar7 == LY_STMT_DESCRIPTION) {
                  plVar8 = *local_78;
                  lVar7 = LY_STMT_DESCRIPTION;
                  pplVar5 = local_78;
                  goto LAB_0017248e;
                }
                if (lVar7 == LY_STMT_EXTENSION_INSTANCE) {
                  exts_00 = (lysp_ext_instance **)0x400;
                  LVar2 = parse_ext(ctx,word,word_len,parent_00,LY_STMT_CONTAINER,0,exts);
                }
                else if (lVar7 == LY_STMT_IF_FEATURE) {
                  LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_70,(yang_arg)exts,exts_00);
                }
                else if (lVar7 == LY_STMT_MUST) {
                  LVar2 = parse_restrs(ctx,(ly_stmt)local_48,restrs);
                }
                else {
                  if (lVar7 == LY_STMT_PRESENCE) {
                    plVar8 = *local_58;
                    lVar7 = LY_STMT_PRESENCE;
                    pplVar5 = local_58;
                  }
                  else {
                    if (lVar7 != LY_STMT_REFERENCE) {
                      if (lVar7 == LY_STMT_STATUS) {
                        LVar2 = parse_status(ctx,local_90,exts);
                      }
                      else if (lVar7 == LY_STMT_TYPEDEF) {
                        LVar2 = parse_typedef(ctx,parent_00,(lysp_tpdf **)local_50);
                      }
                      else {
                        if (lVar7 != LY_STMT_CONFIG) {
                          if (ctx == (lysp_yang_ctx *)0x0) {
                            plVar6 = (ly_ctx *)0x0;
                          }
                          else {
                            plVar6 = (ly_ctx *)
                                     **(undefined8 **)
                                       (ctx->parsed_mods->field_2).dnodes
                                       [ctx->parsed_mods->count - 1];
                          }
                          pcVar4 = lyplg_ext_stmt2str(lVar7);
                          format = "Invalid keyword \"%s\" as a child of \"%s\".";
                          goto LAB_00172671;
                        }
                        LVar2 = parse_config(ctx,local_90,exts);
                      }
                      goto LAB_00172529;
                    }
                    plVar8 = *local_68;
                    lVar7 = LY_STMT_REFERENCE;
                    pplVar5 = local_68;
                  }
LAB_0017248e:
                  exts_00 = (lysp_ext_instance **)0x2;
                  LVar2 = parse_text_field(ctx,plVar8,lVar7,(uint32_t)pplVar5,(char **)0x2,
                                           Y_IDENTIF_ARG,(uint16_t *)exts,
                                           (lysp_ext_instance **)CONCAT44(kw,uStack_b0));
                }
              }
              goto LAB_00172529;
            }
            LVar2 = parse_any(ctx,lVar7,parent_00,(lysp_node **)local_a8);
          }
LAB_00172529:
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          LVar2 = get_keyword(ctx,&kw,&word,&word_len);
          lVar7 = kw;
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
          restrs = extraout_RDX_01;
          if (((!bVar9) && (*exts != (lysp_ext_instance *)0x0)) &&
             (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
             restrs = extraout_RDX_02, LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
        } while( true );
      }
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_container(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = 0;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_container *cont;

    /* create new container structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, cont, next, LY_EMEM);
    cont->nodetype = LYS_CONTAINER;
    cont->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, cont->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &cont->flags, &cont->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, cont->dsc, LY_STMT_DESCRIPTION, 0, &cont->dsc, Y_STR_ARG, NULL, &cont->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &cont->iffeatures, Y_STR_ARG, &cont->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, cont->ref, LY_STMT_REFERENCE, 0, &cont->ref, Y_STR_ARG, NULL, &cont->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &cont->flags, &cont->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &cont->when));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(parse_text_field(ctx, cont->presence, LY_STMT_PRESENCE, 0, &cont->presence, Y_STR_ARG, NULL,
                    &cont->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "container");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)cont, &cont->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)cont, &cont->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)cont, &cont->typedefs));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &cont->musts));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "container");
            LY_CHECK_RET(parse_action(ctx, (struct lysp_node *)cont, &cont->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)cont, &cont->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "container");
            LY_CHECK_RET(parse_notif(ctx, (struct lysp_node *)cont, &cont->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, cont, LY_STMT_CONTAINER, 0, &cont->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "container");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, cont->exts, ret, cleanup);
    }

cleanup:
    return ret;
}